

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O1

void __thiscall fasttext::Meter::writeGeneralMetrics(Meter *this,ostream *out,int32_t k)

{
  uint64_t uVar1;
  ostream *poVar2;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_00 [56];
  undefined1 in_XMM2 [16];
  undefined1 auVar4 [64];
  undefined1 auVar3 [16];
  undefined1 auVar6 [64];
  undefined1 auVar5 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"N",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 3;
  std::__ostream_insert<char,std::char_traits<char>>(out,"P@",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,k);
  auVar6._8_56_ = extraout_var_00;
  auVar6._0_8_ = extraout_XMM1_Qa;
  auVar5 = auVar6._0_16_;
  auVar4._8_56_ = extraout_var;
  auVar4._0_8_ = extraout_XMM0_Qa;
  auVar3 = auVar4._0_16_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
  uVar1 = (this->metrics_).predicted;
  auVar3 = vcvtusi2sd_avx512f(auVar3,(this->metrics_).predictedGold);
  auVar5 = vcvtusi2sd_avx512f(auVar5,uVar1);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((ulong)(uVar1 == 0) * 0x7ff8000000000000 +
                              (ulong)(uVar1 != 0) * (long)(auVar3._0_8_ / auVar5._0_8_)));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"R@",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,k);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
  uVar1 = (this->metrics_).gold;
  auVar3 = vcvtusi2sd_avx512f(in_XMM2,(this->metrics_).predictedGold);
  auVar5 = vcvtusi2sd_avx512f(in_XMM2,uVar1);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((ulong)(uVar1 == 0) * 0x7ff8000000000000 +
                              (ulong)(uVar1 != 0) * (long)(auVar3._0_8_ / auVar5._0_8_)));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Meter::writeGeneralMetrics(std::ostream& out, int32_t k) const {
  out << "N"
      << "\t" << nexamples_ << std::endl;
  out << std::setprecision(3);
  out << "P@" << k << "\t" << metrics_.precision() << std::endl;
  out << "R@" << k << "\t" << metrics_.recall() << std::endl;
}